

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,
          vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
          *motionprimitiveV)

{
  double *pdVar1;
  undefined2 *puVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  undefined1 auVar8 [16];
  double __x;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  undefined1 auVar14 [16];
  double dVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  EnvNAVXYTHETALATAction_t **ppEVar19;
  ulong *puVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  reference pvVar24;
  reference pvVar25;
  long lVar26;
  ulong uVar27;
  int pind;
  ulong uVar28;
  EnvNAVXYTHETALATAction_t *pEVar29;
  long lVar30;
  undefined2 extraout_XMM0_Wa;
  undefined2 uVar31;
  short sVar32;
  undefined2 extraout_XMM0_Wb;
  undefined2 uVar33;
  undefined2 extraout_XMM0_Wc;
  undefined2 uVar34;
  short sVar35;
  undefined2 extraout_XMM0_Wd;
  undefined2 uVar36;
  undefined2 extraout_XMM0_We;
  undefined2 extraout_XMM0_We_00;
  undefined2 extraout_XMM0_We_01;
  undefined2 extraout_XMM0_We_02;
  undefined2 extraout_XMM0_We_03;
  undefined2 extraout_XMM0_We_04;
  undefined2 extraout_XMM0_We_05;
  undefined2 extraout_XMM0_Wf;
  undefined2 extraout_XMM0_Wf_00;
  undefined2 extraout_XMM0_Wf_01;
  undefined2 extraout_XMM0_Wf_02;
  undefined2 extraout_XMM0_Wf_03;
  undefined2 extraout_XMM0_Wf_04;
  undefined2 extraout_XMM0_Wf_05;
  undefined2 extraout_XMM0_Wg;
  undefined2 extraout_XMM0_Wg_00;
  undefined2 extraout_XMM0_Wg_01;
  undefined2 extraout_XMM0_Wg_02;
  undefined2 extraout_XMM0_Wg_03;
  undefined2 extraout_XMM0_Wg_04;
  undefined2 extraout_XMM0_Wg_05;
  undefined2 extraout_XMM0_Wh;
  undefined2 extraout_XMM0_Wh_00;
  undefined2 extraout_XMM0_Wh_01;
  undefined2 extraout_XMM0_Wh_02;
  undefined2 extraout_XMM0_Wh_03;
  undefined2 extraout_XMM0_Wh_04;
  undefined2 extraout_XMM0_Wh_05;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  value_type local_148;
  EnvNAVXYTHETALATAction_t *local_128;
  EnvNAVXYTHETALATAction_t *pEStack_120;
  undefined1 local_118 [10];
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_d0;
  undefined1 local_c8 [16];
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  _Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  _Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_48;
  
  iVar17 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar28 = (ulong)iVar17;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar28;
  uVar18 = SUB168(auVar38 * ZEXT816(0x18),0);
  uVar22 = 0xffffffffffffffff;
  uVar23 = uVar18 + 8;
  if (0xfffffffffffffff7 < uVar18) {
    uVar23 = uVar22;
  }
  if (SUB168(auVar38 * ZEXT816(0x18),8) != 0) {
    uVar23 = uVar22;
  }
  uVar27 = uVar28 * 8;
  if (iVar17 < 0) {
    uVar27 = uVar22;
  }
  ppEVar19 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar27);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar19;
  puVar20 = (ulong *)operator_new__(uVar23);
  *puVar20 = uVar28;
  uVar31 = extraout_XMM0_We;
  uVar33 = extraout_XMM0_Wf;
  uVar34 = extraout_XMM0_Wg;
  uVar36 = extraout_XMM0_Wh;
  if (iVar17 != 0) {
    memset((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
           (puVar20 + 1),0,((uVar18 - 0x18) - (uVar18 - 0x18) % 0x18) + 0x18);
    uVar31 = extraout_XMM0_We_00;
    uVar33 = extraout_XMM0_Wf_00;
    uVar34 = extraout_XMM0_Wg_00;
    uVar36 = extraout_XMM0_Wh_00;
  }
  (this->EnvNAVXYTHETALATCfg).PredActionsV =
       (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
       (puVar20 + 1);
  uVar22 = CONCAT26(uVar36,CONCAT24(uVar34,CONCAT22(uVar33,uVar31))) ^
           CONCAT26(uVar36,CONCAT24(uVar34,CONCAT22(uVar33,uVar31)));
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = (undefined2)uVar22;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish._2_2_ = (undefined2)(uVar22 >> 0x10);
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = (undefined2)(uVar22 >> 0x20);
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = (undefined2)(uVar22 >> 0x30);
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start._2_2_ = 0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start._4_2_ = 0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start._6_2_ = 0;
  footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = &(this->EnvNAVXYTHETALATCfg).FootprintPolygon;
  lVar26 = 0;
  while( true ) {
    pSVar3 = (motionprimitiveV->
             super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (motionprimitiveV->
             super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar21 = (long)pSVar4 - (long)pSVar3;
    uVar22 = lVar21 / 0x38;
    if (iVar17 <= lVar26) break;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar22;
    uVar18 = SUB168(auVar8 * ZEXT816(0x68),0);
    uVar23 = uVar18 + 8;
    if (0xfffffffffffffff7 < uVar18) {
      uVar23 = 0xffffffffffffffff;
    }
    if (SUB168(auVar8 * ZEXT816(0x68),8) != 0) {
      uVar23 = 0xffffffffffffffff;
    }
    puVar20 = (ulong *)operator_new__(uVar23);
    *puVar20 = uVar22;
    uVar23 = CONCAT26(extraout_XMM0_Wh_01,
                      CONCAT24(extraout_XMM0_Wg_01,CONCAT22(extraout_XMM0_Wf_01,extraout_XMM0_We_01)
                              )) ^
             CONCAT26(extraout_XMM0_Wh_01,
                      CONCAT24(extraout_XMM0_Wg_01,CONCAT22(extraout_XMM0_Wf_01,extraout_XMM0_We_01)
                              ));
    uVar31 = (undefined2)uVar23;
    uVar33 = (undefined2)(uVar23 >> 0x10);
    uVar34 = (undefined2)(uVar23 >> 0x20);
    uVar36 = (undefined2)(uVar23 >> 0x30);
    if (pSVar4 != pSVar3) {
      lVar21 = 0;
      do {
        puVar2 = (undefined2 *)((long)puVar20 + lVar21 + 0x48);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = uVar31;
        puVar2[5] = uVar33;
        puVar2[6] = uVar34;
        puVar2[7] = uVar36;
        puVar2 = (undefined2 *)((long)puVar20 + lVar21 + 0x38);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = uVar31;
        puVar2[5] = uVar33;
        puVar2[6] = uVar34;
        puVar2[7] = uVar36;
        *(undefined8 *)((long)puVar20 + lVar21 + 0x58) = 0;
        puVar2 = (undefined2 *)((long)puVar20 + lVar21 + 0x28);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = uVar31;
        puVar2[5] = uVar33;
        puVar2[6] = uVar34;
        puVar2[7] = uVar36;
        puVar2 = (undefined2 *)((long)puVar20 + lVar21 + 0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = uVar31;
        puVar2[5] = uVar33;
        puVar2[6] = uVar34;
        puVar2[7] = uVar36;
        lVar21 = lVar21 + 0x68;
      } while (uVar22 * 0x68 - lVar21 != 0);
    }
    (this->EnvNAVXYTHETALATCfg).ActionsV[lVar26] = (EnvNAVXYTHETALATAction_t *)(puVar20 + 1);
    local_108._8_8_ = 0;
    local_108._0_8_ = (this->EnvNAVXYTHETALATCfg).cellsize_m;
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])(this);
    __x = (double)CONCAT26(extraout_XMM0_Wd,
                           CONCAT24(extraout_XMM0_Wc,CONCAT22(extraout_XMM0_Wb,extraout_XMM0_Wa)));
    dVar15 = (double)local_108._0_8_ * 0.0 + (double)local_108._0_8_ * 0.5;
    local_108._8_4_ = SUB84(dVar15,0);
    local_108._0_8_ = dVar15;
    local_108._12_4_ = (int)((ulong)dVar15 >> 0x20);
    for (uVar22 = 0;
        uVar22 < (ulong)(((long)(motionprimitiveV->
                                super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(motionprimitiveV->
                               super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                               )._M_impl.super__Vector_impl_data._M_start) / 0x38);
        uVar22 = uVar22 + 1) {
      pEVar29 = (this->EnvNAVXYTHETALATCfg).ActionsV[lVar26];
      pEVar29[uVar22].aind = (uchar)uVar22;
      pEVar29[uVar22].starttheta = (char)lVar26;
      pvVar24 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      pvVar25 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      dVar15 = *(double *)
                ((long)(pvVar25->intermptV).
                       super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish +
                (long)(pvVar24->intermptV).
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                (-0x18 - (long)(pvVar25->intermptV).
                               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      pvVar24 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      pvVar25 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      stack0xfffffffffffffef0 = 0.0;
      local_118._0_8_ =
           *(ulong *)((long)(pvVar25->intermptV).
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar24->intermptV).
                           super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-0x10 - (long)(pvVar25->intermptV).
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start));
      pvVar24 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      pvVar25 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (motionprimitiveV,uVar22);
      local_128 = *(EnvNAVXYTHETALATAction_t **)
                   ((long)(pvVar25->intermptV).
                          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                   (long)(pvVar24->intermptV).
                         super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                   (-8 - (long)(pvVar25->intermptV).
                               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      dVar10 = cos(__x);
      local_e8._8_2_ = extraout_XMM0_We_02;
      local_e8._0_8_ = dVar10;
      local_e8._10_2_ = extraout_XMM0_Wf_02;
      local_e8._12_2_ = extraout_XMM0_Wg_02;
      local_e8._14_2_ = extraout_XMM0_Wh_02;
      dVar10 = sin(__x);
      dVar11 = sin(__x);
      dVar12 = cos(__x);
      local_f8._0_8_ = (this->EnvNAVXYTHETALATCfg).cellsize_m;
      local_f8._8_4_ = *(int *)((long)((this->EnvNAVXYTHETALATCfg).dXY + 0) + 0);
      local_f8._12_4_ = *(int *)((long)((this->EnvNAVXYTHETALATCfg).dXY + 0) + 4);
      iVar16 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])(this);
      auVar37._0_8_ =
           (double)local_e8._0_8_ * dVar15 + -(double)local_118._0_8_ * dVar10 +
           (double)local_108._0_8_;
      auVar37._8_8_ = dVar11 * dVar15 + dVar12 * (double)local_118._0_8_ + (double)local_108._8_8_;
      lVar21 = -(ulong)(auVar37._8_8_ < 0.0);
      auVar14._8_4_ = local_f8._0_4_;
      auVar14._0_8_ = local_f8._0_8_;
      auVar14._12_4_ = local_f8._4_4_;
      auVar38 = divpd(auVar37,auVar14);
      iVar17 = (int)auVar38._0_8_ - (uint)(auVar37._0_8_ < 0.0);
      iVar13 = (int)lVar21 + (int)auVar38._8_8_;
      ppEVar19 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      pEVar29 = ppEVar19[lVar26];
      pEVar29[uVar22].endtheta = (char)iVar16;
      auVar9._4_2_ = (short)iVar13;
      auVar9._0_4_ = iVar17;
      auVar9._6_2_ = (short)((uint)iVar13 >> 0x10);
      auVar9._8_2_ = (short)lVar21;
      auVar9._10_2_ = (short)((ulong)lVar21 >> 0x10);
      auVar9._12_2_ = (short)((ulong)lVar21 >> 0x20);
      auVar9._14_2_ = (short)((ulong)lVar21 >> 0x30);
      local_c8[0] = (char)iVar17;
      local_c8[4] = (char)iVar13;
      pEVar29[uVar22].dX = local_c8[0];
      pEVar29[uVar22].dY = local_c8[4];
      local_c8 = auVar9;
      if (local_c8[4] == '\0' && local_c8[0] == '\0') {
        dVar15 = (this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs;
        dVar10 = computeMinUnsignedAngleDiff((double)local_128,0.0);
        dVar15 = (ABS(dVar10) * dVar15 * 1000.0) / 0.7853981633974483;
        uVar31 = SUB82(dVar15,0);
        uVar33 = (undefined2)((ulong)dVar15 >> 0x10);
        uVar34 = (undefined2)((ulong)dVar15 >> 0x20);
        uVar36 = (undefined2)((ulong)dVar15 >> 0x30);
        ppEVar19 = (this->EnvNAVXYTHETALATCfg).ActionsV;
        pEVar29 = ppEVar19[lVar26];
      }
      else {
        sVar32 = (short)local_c8[0];
        sVar35 = (short)local_c8[4];
        dVar15 = ceil(SQRT((double)((int)(short)(sVar35 * sVar35) + (int)(short)(sVar32 * sVar32)))
                      * (((this->EnvNAVXYTHETALATCfg).cellsize_m * 1000.0) /
                        (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs));
        uVar31 = SUB82(dVar15,0);
        uVar33 = (undefined2)((ulong)dVar15 >> 0x10);
        uVar34 = (undefined2)((ulong)dVar15 >> 0x20);
        uVar36 = (undefined2)((ulong)dVar15 >> 0x30);
      }
      pEVar29[uVar22].cost = (int)(double)CONCAT26(uVar36,CONCAT24(uVar34,CONCAT22(uVar33,uVar31)));
      psVar5 = pEVar29[uVar22].intersectingcellsV.
               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar29[uVar22].intersectingcellsV.
          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar5) {
        pEVar29[uVar22].intersectingcellsV.
        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar5;
        pEVar29 = ppEVar19[lVar26];
      }
      psVar6 = pEVar29[uVar22].intermptV.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar29[uVar22].intermptV.
          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar6) {
        pEVar29[uVar22].intermptV.
        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar6;
        pEVar29 = ppEVar19[lVar26];
      }
      psVar7 = pEVar29[uVar22].interm3DcellsV.
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pEVar29[uVar22].interm3DcellsV.
          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar7) {
        pEVar29[uVar22].interm3DcellsV.
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar7;
      }
      lVar30 = 0;
      lVar21 = 0;
      while( true ) {
        pvVar24 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                            (motionprimitiveV,uVar22);
        if ((int)(((long)(pvVar24->intermptV).
                         super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar24->intermptV).
                        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x18) <= lVar21) break;
        pvVar24 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                            (motionprimitiveV,uVar22);
        psVar6 = (pvVar24->intermptV).
                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&psVar6->x + lVar30);
        local_128 = (EnvNAVXYTHETALATAction_t *)*pdVar1;
        pEStack_120 = (EnvNAVXYTHETALATAction_t *)pdVar1[1];
        local_148.theta = *(double *)((long)&psVar6->theta + lVar30);
        local_148.x = (double)local_128;
        local_148.y = (double)pEStack_120;
        dVar15 = cos(__x);
        dVar10 = local_148.y;
        local_e8._8_2_ = extraout_XMM0_We_03;
        local_e8._0_8_ = dVar15;
        local_e8._10_2_ = extraout_XMM0_Wf_03;
        local_e8._12_2_ = extraout_XMM0_Wg_03;
        local_e8._14_2_ = extraout_XMM0_Wh_03;
        dVar15 = sin(__x);
        local_118._8_2_ = extraout_XMM0_We_04;
        local_118._0_8_ = dVar15;
        uStack_10e = extraout_XMM0_Wf_04;
        uStack_10c = extraout_XMM0_Wg_04;
        uStack_10a = extraout_XMM0_Wh_04;
        pEStack_120 = (EnvNAVXYTHETALATAction_t *)local_148.x;
        dVar15 = sin(__x);
        local_f8._8_2_ = extraout_XMM0_We_05;
        local_f8._0_8_ = dVar15;
        local_f8._10_2_ = extraout_XMM0_Wf_05;
        local_f8._12_2_ = extraout_XMM0_Wg_05;
        local_f8._14_2_ = extraout_XMM0_Wh_05;
        local_118._8_2_ = SUB82(local_148.y,0);
        uStack_10e = (short)((ulong)local_148.y >> 0x10);
        uStack_10c = (short)((ulong)local_148.y >> 0x20);
        uStack_10a = (short)((ulong)local_148.y >> 0x30);
        dVar15 = cos(__x);
        dVar15 = (double)local_f8._0_8_ * (double)pEStack_120 + dVar15 * stack0xfffffffffffffef0;
        local_148.y._0_2_ = SUB82(dVar15,0);
        local_148.x = (double)local_e8._0_8_ * (double)local_128 + -dVar10 * (double)local_118._0_8_
        ;
        local_148.y._2_2_ = (short)((ulong)dVar15 >> 0x10);
        local_148.y._4_2_ = (short)((ulong)dVar15 >> 0x20);
        local_148.y._6_2_ = (short)((ulong)dVar15 >> 0x30);
        local_148.theta = normalizeAngle(local_148.theta + __x);
        std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::push_back
                  (&(this->EnvNAVXYTHETALATCfg).ActionsV[lVar26][uVar22].intermptV,&local_148);
        lVar21 = lVar21 + 1;
        lVar30 = lVar30 + 0x18;
      }
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_60,local_d0);
      std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
                ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)&local_48,
                 &(this->EnvNAVXYTHETALATCfg).ActionsV[lVar26][uVar22].intermptV);
      get_2d_motion_cells((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_60,
                          (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                          &local_48,
                          &(this->EnvNAVXYTHETALATCfg).ActionsV[lVar26][uVar22].intersectingcellsV,
                          (this->EnvNAVXYTHETALATCfg).cellsize_m);
      std::_Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~_Vector_base
                (&local_48);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base(&local_60);
      pEVar29 = (this->EnvNAVXYTHETALATCfg).ActionsV[lVar26];
      iVar17 = (int)pEVar29[uVar22].endtheta;
      local_148.x = (double)(pEVar29 + uVar22);
      std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
      emplace_back<EnvNAVXYTHETALATAction_t*>
                ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                 ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                 ((iVar17 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar17)),
                 (EnvNAVXYTHETALATAction_t **)&local_148);
    }
    lVar26 = lVar26 + 1;
    iVar17 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  }
  (this->EnvNAVXYTHETALATCfg).actionwidth = (int)uVar22;
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])
            (this,lVar26,lVar21 % 0x38);
  std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
            (&footprint.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive(
    std::vector<SBPL_xytheta_mprimitive>* motionprimitiveV)
{
    SBPL_PRINTF("Pre-computing action data using base motion primitives...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;

    //iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("pre-computing for angle %d out of %d angles\n", tind, EnvNAVXYTHETALATCfg.NumThetaDirs);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[motionprimitiveV->size()];

        //compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(tind);
    //sourcepose.theta = DiscTheta2Cont(tind, EnvNAVXYTHETALATCfg.NumThetaDirs);

        //iterate over motion primitives
        for (size_t aind = 0; aind < motionprimitiveV->size(); aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            double mp_endx_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].x;
            double mp_endy_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].y;
            double mp_endtheta_rad =
                    motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].theta;

            double endx = sourcepose.x + (mp_endx_m * cos(sourcepose.theta) - mp_endy_m * sin(sourcepose.theta));
            double endy = sourcepose.y + (mp_endx_m * sin(sourcepose.theta) + mp_endy_m * cos(sourcepose.theta));

            int endx_c = CONTXY2DISC(endx, EnvNAVXYTHETALATCfg.cellsize_m);
            int endy_c = CONTXY2DISC(endy, EnvNAVXYTHETALATCfg.cellsize_m);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2DiscNew(mp_endtheta_rad + sourcepose.theta);
        //EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2Disc(mp_endtheta_rad + sourcepose.theta, EnvNAVXYTHETALATCfg.NumThetaDirs);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = endx_c;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = endy_c;

            if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY != 0 || EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX != 0)
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs
                    * sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));
            else
                //cost of turn in place
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs
                    * fabs(computeMinUnsignedAngleDiff(mp_endtheta_rad, 0)) / (PI_CONST / 4.0));

            //compute and store interm points as well as intersecting cells
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].interm3DcellsV.clear();
            sbpl_xy_theta_cell_t previnterm3Dcell;
            previnterm3Dcell.theta = previnterm3Dcell.x = previnterm3Dcell.y = 0;

            for (int pind = 0; pind < (int)motionprimitiveV->at(aind).intermptV.size(); pind++) {
                sbpl_xy_theta_pt_t intermpt = motionprimitiveV->at(aind).intermptV[pind];

                //rotate it appropriately
                double rotx = intermpt.x * cos(sourcepose.theta) - intermpt.y * sin(sourcepose.theta);
                double roty = intermpt.x * sin(sourcepose.theta) + intermpt.y * cos(sourcepose.theta);
                intermpt.x = rotx;
                intermpt.y = roty;
                intermpt.theta = normalizeAngle(sourcepose.theta + intermpt.theta);

                //store it (they are with reference to 0,0,stattheta (not
                //sourcepose.x,sourcepose.y,starttheta (that is, half-bin))
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.push_back(intermpt);
            }
            //now compute the intersecting cells for this motion (including ignoring the source footprint)
            get_2d_motion_cells(EnvNAVXYTHETALATCfg.FootprintPolygon,
                                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV,
                                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                                EnvNAVXYTHETALATCfg.cellsize_m);

#if DEBUG
            SBPL_FPRINTF(fDeb,
                         "action tind=%d aind=%d: dX=%d dY=%d endtheta=%d (%.2f degs -> %.2f degs) "
                         "cost=%d (mprim: %.2f %.2f %.2f)\n",
                         tind,
                         (int)aind,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                         sourcepose.theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV[EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.size() - 1].theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost,
                         mp_endx_m,
                         mp_endy_m,
                         mp_endtheta_rad);
#endif

            //add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }
    }

    //set number of actions
    EnvNAVXYTHETALATCfg.actionwidth = motionprimitiveV->size();

    //now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data based on motion primitives\n");
}